

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

bool GetDiscardMove(int card_index,pyhanabi_move_t *move)

{
  HanabiMove *this;
  long *in_RSI;
  int8_t in_DIL;
  
  if (in_RSI != (long *)0x0) {
    this = (HanabiMove *)operator_new(8);
    hanabi_learning_env::HanabiMove::HanabiMove(this,kDiscard,in_DIL,-1,-1,-1);
    *in_RSI = (long)this;
    return *in_RSI != 0;
  }
  __assert_fail("move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0xa9,"bool GetDiscardMove(int, pyhanabi_move_t *)");
}

Assistant:

bool GetDiscardMove(int card_index, pyhanabi_move_t* move) {
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      hanabi_learning_env::HanabiMove::kDiscard, card_index, -1, -1, -1);
  return move->move != nullptr;
}